

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_impl.hpp
# Opt level: O2

void __thiscall lightconf::value::value(value *this,string *str)

{
  _Rb_tree_header *p_Var1;
  
  this->type_ = string_type;
  std::__cxx11::string::string((string *)&this->string_value_,(string *)str);
  p_Var1 = &(this->group_value_).values_._M_t._M_impl.super__Rb_tree_header;
  *(undefined8 *)&(this->group_value_).values_._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->group_value_).values_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->vector_value_).super__Vector_base<lightconf::value,_std::allocator<lightconf::value>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined8 *)&(this->group_value_).values_._M_t._M_impl = 0;
  (this->vector_value_).super__Vector_base<lightconf::value,_std::allocator<lightconf::value>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->vector_value_).super__Vector_base<lightconf::value,_std::allocator<lightconf::value>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->group_value_).values_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->group_value_).values_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->group_value_).values_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->group_value_).order_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->group_value_).order_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->group_value_).order_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

inline value::value(const std::string& str)     : type_(value_type::string_type), string_value_(str) { }